

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

void edition_unittest::TestAllTypes::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  intptr_t iVar7;
  size_t *psVar8;
  undefined8 *puVar9;
  void *pvVar10;
  _func_int **pp_Var11;
  Arena *in_RCX;
  Arena *pAVar12;
  size_t *psVar13;
  undefined8 *puVar14;
  char *extraout_RDX;
  char *pcVar15;
  char *extraout_RDX_00;
  uint unaff_EBP;
  string *value;
  MessageLite *pMVar16;
  MessageLite *pMVar17;
  MessageLite *pMVar18;
  Arena *arena;
  bool bVar19;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string_view value_06;
  
  pMVar18 = (MessageLite *)&stack0xffffffffffffffc8;
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg != to_msg) {
    google::protobuf::RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)(to_msg + 2),(RepeatedField<int> *)(from_msg + 2));
    google::protobuf::RepeatedField<long>::MergeFrom
              ((RepeatedField<long> *)&to_msg[3]._internal_metadata_,
               (RepeatedField<long> *)&from_msg[3]._internal_metadata_);
    google::protobuf::RepeatedField<unsigned_int>::MergeFrom
              ((RepeatedField<unsigned_int> *)(to_msg + 5),
               (RepeatedField<unsigned_int> *)(from_msg + 5));
    google::protobuf::RepeatedField<unsigned_long>::MergeFrom
              ((RepeatedField<unsigned_long> *)&to_msg[6]._internal_metadata_,
               (RepeatedField<unsigned_long> *)&from_msg[6]._internal_metadata_);
    google::protobuf::RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)(to_msg + 8),(RepeatedField<int> *)(from_msg + 8));
    google::protobuf::RepeatedField<long>::MergeFrom
              ((RepeatedField<long> *)&to_msg[9]._internal_metadata_,
               (RepeatedField<long> *)&from_msg[9]._internal_metadata_);
    google::protobuf::RepeatedField<unsigned_int>::MergeFrom
              ((RepeatedField<unsigned_int> *)(to_msg + 0xb),
               (RepeatedField<unsigned_int> *)(from_msg + 0xb));
    google::protobuf::RepeatedField<unsigned_long>::MergeFrom
              ((RepeatedField<unsigned_long> *)(to_msg + 0xc),
               (RepeatedField<unsigned_long> *)(from_msg + 0xc));
    google::protobuf::RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)(to_msg + 0xd),(RepeatedField<int> *)(from_msg + 0xd));
    google::protobuf::RepeatedField<long>::MergeFrom
              ((RepeatedField<long> *)(to_msg + 0xe),(RepeatedField<long> *)(from_msg + 0xe));
    google::protobuf::RepeatedField<float>::MergeFrom
              ((RepeatedField<float> *)(to_msg + 0xf),(RepeatedField<float> *)(from_msg + 0xf));
    google::protobuf::RepeatedField<double>::MergeFrom
              ((RepeatedField<double> *)(to_msg + 0x10),(RepeatedField<double> *)(from_msg + 0x10));
    google::protobuf::RepeatedField<bool>::MergeFrom
              ((RepeatedField<bool> *)(to_msg + 0x11),(RepeatedField<bool> *)(from_msg + 0x11));
    if ((int)from_msg[0x12]._internal_metadata_.ptr_ != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
                ((RepeatedPtrFieldBase *)(to_msg + 0x12),(RepeatedPtrFieldBase *)(from_msg + 0x12));
    }
    if (*(int *)&from_msg[0x14]._vptr_MessageLite != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
                ((RepeatedPtrFieldBase *)&to_msg[0x13]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[0x13]._internal_metadata_);
    }
    if ((int)from_msg[0x15]._internal_metadata_.ptr_ != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)(to_msg + 0x15),(RepeatedPtrFieldBase *)(from_msg + 0x15),
                 google::protobuf::Arena::
                 CopyConstruct<edition_unittest::TestAllTypes_RepeatedGroup>);
    }
    if (*(int *)&from_msg[0x17]._vptr_MessageLite != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[0x16]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[0x16]._internal_metadata_,
                 google::protobuf::Arena::
                 CopyConstruct<edition_unittest::TestAllTypes_NestedMessage>);
    }
    if ((int)from_msg[0x18]._internal_metadata_.ptr_ != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)(to_msg + 0x18),(RepeatedPtrFieldBase *)(from_msg + 0x18),
                 google::protobuf::Arena::CopyConstruct<edition_unittest::ForeignMessage>);
    }
    if (*(int *)&from_msg[0x1a]._vptr_MessageLite != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[0x19]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[0x19]._internal_metadata_,
                 google::protobuf::Arena::CopyConstruct<proto2_unittest_import::ImportMessage>);
    }
    google::protobuf::RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)(to_msg + 0x1b),(RepeatedField<int> *)(from_msg + 0x1b));
    google::protobuf::RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)&to_msg[0x1c]._internal_metadata_,
               (RepeatedField<int> *)&from_msg[0x1c]._internal_metadata_);
    google::protobuf::RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)(to_msg + 0x1e),(RepeatedField<int> *)(from_msg + 0x1e));
    if (*(int *)&from_msg[0x20]._vptr_MessageLite != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
                ((RepeatedPtrFieldBase *)&to_msg[0x1f]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[0x1f]._internal_metadata_);
    }
    if ((int)from_msg[0x21]._internal_metadata_.ptr_ != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
                ((RepeatedPtrFieldBase *)(to_msg + 0x21),(RepeatedPtrFieldBase *)(from_msg + 0x21));
    }
    if (*(int *)&from_msg[0x23]._vptr_MessageLite != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[0x22]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[0x22]._internal_metadata_,
                 google::protobuf::Arena::
                 CopyConstruct<edition_unittest::TestAllTypes_NestedMessage>);
    }
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((char)unaff_EBP != '\0') {
      if ((unaff_EBP & 1) != 0) {
        puVar9 = (undefined8 *)((ulong)from_msg[0x24]._vptr_MessageLite & 0xfffffffffffffffc);
        pcVar15 = (char *)*puVar9;
        pMVar16 = (MessageLite *)puVar9[1];
        *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
        pMVar17 = to_msg + 0x24;
        in_RCX = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)in_RCX & 1) != 0) goto LAB_00c1e3ac;
        goto LAB_00c1dbd4;
      }
      goto LAB_00c1dbd9;
    }
    goto LAB_00c1dd50;
  }
  pMVar16 = to_msg;
  pMVar17 = from_msg;
  MergeImpl();
  pcVar15 = extraout_RDX;
LAB_00c1e3ac:
  in_RCX = *(Arena **)((ulong)in_RCX & 0xfffffffffffffffe);
LAB_00c1dbd4:
  value_00._M_str = pcVar15;
  value_00._M_len = (size_t)pMVar16;
  google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)pMVar17,value_00,in_RCX);
LAB_00c1dbd9:
  if ((unaff_EBP & 2) != 0) {
    puVar9 = (undefined8 *)(from_msg[0x24]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    pcVar15 = (char *)*puVar9;
    sVar5 = puVar9[1];
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 2;
    in_RCX = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)in_RCX & 1) != 0) {
      in_RCX = *(Arena **)((ulong)in_RCX & 0xfffffffffffffffe);
    }
    value_01._M_str = pcVar15;
    value_01._M_len = sVar5;
    google::protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)&to_msg[0x24]._internal_metadata_,value_01,in_RCX);
  }
  if ((unaff_EBP & 4) != 0) {
    puVar9 = (undefined8 *)((ulong)from_msg[0x25]._vptr_MessageLite & 0xfffffffffffffffc);
    pcVar15 = (char *)*puVar9;
    sVar5 = puVar9[1];
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 4;
    in_RCX = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)in_RCX & 1) != 0) {
      in_RCX = *(Arena **)((ulong)in_RCX & 0xfffffffffffffffe);
    }
    value_02._M_str = pcVar15;
    value_02._M_len = sVar5;
    google::protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)(to_msg + 0x25),value_02,in_RCX);
  }
  if ((unaff_EBP & 8) != 0) {
    uVar6 = from_msg[0x25]._internal_metadata_.ptr_;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 8;
    pAVar12 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar12 & 1) != 0) {
      pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[0x25]._internal_metadata_,
               (string *)(uVar6 & 0xfffffffffffffffc),pAVar12);
  }
  if ((unaff_EBP & 0x10) == 0) {
LAB_00c1dca9:
    if ((unaff_EBP & 0x20) != 0) {
      pMVar17 = (MessageLite *)from_msg[0x26]._internal_metadata_.ptr_;
      if (pMVar17 == (MessageLite *)0x0) goto LAB_00c1e3e4;
      pMVar16 = (MessageLite *)to_msg[0x26]._internal_metadata_.ptr_;
      if (pMVar16 == (MessageLite *)0x0) {
        pvVar10 = google::protobuf::Arena::
                  CopyConstruct<edition_unittest::TestAllTypes_NestedMessage>(arena,pMVar17);
        to_msg[0x26]._internal_metadata_.ptr_ = (intptr_t)pvVar10;
      }
      else {
        TestAllTypes_NestedMessage::MergeImpl(pMVar16,pMVar17);
      }
    }
    if ((unaff_EBP & 0x40) != 0) {
      pMVar17 = (MessageLite *)from_msg[0x27]._vptr_MessageLite;
      if (pMVar17 == (MessageLite *)0x0) goto LAB_00c1e3ec;
      if ((MessageLite *)to_msg[0x27]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var11 = (_func_int **)
                   google::protobuf::Arena::CopyConstruct<edition_unittest::ForeignMessage>
                             (arena,pMVar17);
        to_msg[0x27]._vptr_MessageLite = pp_Var11;
      }
      else {
        ForeignMessage::MergeImpl((MessageLite *)to_msg[0x27]._vptr_MessageLite,pMVar17);
      }
    }
    if ((char)unaff_EBP < '\0') {
      pMVar17 = (MessageLite *)from_msg[0x27]._internal_metadata_.ptr_;
      if (pMVar17 != (MessageLite *)0x0) {
        pMVar16 = (MessageLite *)to_msg[0x27]._internal_metadata_.ptr_;
        if (pMVar16 == (MessageLite *)0x0) {
          pvVar10 = google::protobuf::Arena::CopyConstruct<proto2_unittest_import::ImportMessage>
                              (arena,pMVar17);
          to_msg[0x27]._internal_metadata_.ptr_ = (intptr_t)pvVar10;
        }
        else {
          proto2_unittest_import::ImportMessage::MergeImpl(pMVar16,pMVar17);
        }
        goto LAB_00c1dd50;
      }
      goto LAB_00c1e3fc;
    }
LAB_00c1dd50:
    if ((unaff_EBP & 0xff00) != 0) {
      if ((unaff_EBP >> 8 & 1) != 0) {
        pMVar17 = (MessageLite *)from_msg[0x28]._vptr_MessageLite;
        if (pMVar17 == (MessageLite *)0x0) goto LAB_00c1e3f4;
        if ((MessageLite *)to_msg[0x28]._vptr_MessageLite == (MessageLite *)0x0) {
          pp_Var11 = (_func_int **)
                     google::protobuf::Arena::
                     CopyConstruct<proto2_unittest_import::PublicImportMessage>(arena,pMVar17);
          to_msg[0x28]._vptr_MessageLite = pp_Var11;
        }
        else {
          proto2_unittest_import::PublicImportMessage::MergeImpl
                    ((MessageLite *)to_msg[0x28]._vptr_MessageLite,pMVar17);
        }
      }
      if ((unaff_EBP >> 9 & 1) != 0) {
        pMVar17 = (MessageLite *)from_msg[0x28]._internal_metadata_.ptr_;
        if (pMVar17 != (MessageLite *)0x0) {
          pMVar16 = (MessageLite *)to_msg[0x28]._internal_metadata_.ptr_;
          if (pMVar16 == (MessageLite *)0x0) {
            pvVar10 = google::protobuf::Arena::
                      CopyConstruct<edition_unittest::TestAllTypes_NestedMessage>(arena,pMVar17);
            to_msg[0x28]._internal_metadata_.ptr_ = (intptr_t)pvVar10;
          }
          else {
            TestAllTypes_NestedMessage::MergeImpl(pMVar16,pMVar17);
          }
          goto LAB_00c1ddcc;
        }
        goto LAB_00c1e404;
      }
LAB_00c1ddcc:
      if ((unaff_EBP >> 10 & 1) == 0) {
LAB_00c1de04:
        if ((unaff_EBP >> 0xb & 1) != 0) {
          to_msg[0x29]._internal_metadata_.ptr_ = from_msg[0x29]._internal_metadata_.ptr_;
        }
        if ((unaff_EBP >> 0xc & 1) != 0) {
          *(undefined4 *)&to_msg[0x2a]._vptr_MessageLite =
               *(undefined4 *)&from_msg[0x2a]._vptr_MessageLite;
        }
        if ((unaff_EBP >> 0xd & 1) != 0) {
          *(undefined4 *)((long)&to_msg[0x2a]._vptr_MessageLite + 4) =
               *(undefined4 *)((long)&from_msg[0x2a]._vptr_MessageLite + 4);
        }
        if ((unaff_EBP >> 0xe & 1) != 0) {
          to_msg[0x2a]._internal_metadata_.ptr_ = from_msg[0x2a]._internal_metadata_.ptr_;
        }
        if ((short)unaff_EBP < 0) {
          to_msg[0x2b]._vptr_MessageLite = from_msg[0x2b]._vptr_MessageLite;
        }
        goto LAB_00c1de65;
      }
      pMVar17 = (MessageLite *)from_msg[0x29]._vptr_MessageLite;
      if (pMVar17 != (MessageLite *)0x0) {
        if ((MessageLite *)to_msg[0x29]._vptr_MessageLite == (MessageLite *)0x0) {
          pp_Var11 = (_func_int **)
                     google::protobuf::Arena::
                     CopyConstruct<edition_unittest::TestAllTypes_NestedMessage>(arena,pMVar17);
          to_msg[0x29]._vptr_MessageLite = pp_Var11;
        }
        else {
          TestAllTypes_NestedMessage::MergeImpl
                    ((MessageLite *)to_msg[0x29]._vptr_MessageLite,pMVar17);
        }
        goto LAB_00c1de04;
      }
      goto LAB_00c1e40c;
    }
LAB_00c1de65:
    if ((unaff_EBP & 0xff0000) != 0) {
      if ((unaff_EBP >> 0x10 & 1) != 0) {
        *(int *)&to_msg[0x2b]._internal_metadata_.ptr_ =
             (int)from_msg[0x2b]._internal_metadata_.ptr_;
      }
      if ((unaff_EBP >> 0x11 & 1) != 0) {
        *(undefined4 *)((long)&to_msg[0x2b]._internal_metadata_.ptr_ + 4) =
             *(undefined4 *)((long)&from_msg[0x2b]._internal_metadata_.ptr_ + 4);
      }
      if ((unaff_EBP >> 0x12 & 1) != 0) {
        to_msg[0x2c]._vptr_MessageLite = from_msg[0x2c]._vptr_MessageLite;
      }
      if ((unaff_EBP >> 0x13 & 1) != 0) {
        to_msg[0x2c]._internal_metadata_.ptr_ = from_msg[0x2c]._internal_metadata_.ptr_;
      }
      if ((unaff_EBP >> 0x14 & 1) != 0) {
        *(undefined4 *)&to_msg[0x2d]._vptr_MessageLite =
             *(undefined4 *)&from_msg[0x2d]._vptr_MessageLite;
      }
      if ((unaff_EBP >> 0x15 & 1) != 0) {
        *(undefined4 *)((long)&to_msg[0x2d]._vptr_MessageLite + 4) =
             *(undefined4 *)((long)&from_msg[0x2d]._vptr_MessageLite + 4);
      }
      if ((unaff_EBP >> 0x16 & 1) != 0) {
        to_msg[0x2d]._internal_metadata_.ptr_ = from_msg[0x2d]._internal_metadata_.ptr_;
      }
      if ((unaff_EBP >> 0x17 & 1) != 0) {
        *(undefined1 *)&to_msg[0x2e]._vptr_MessageLite =
             *(undefined1 *)&from_msg[0x2e]._vptr_MessageLite;
      }
    }
    if (0xffffff < unaff_EBP) {
      if ((unaff_EBP >> 0x18 & 1) != 0) {
        *(undefined4 *)((long)&to_msg[0x2e]._vptr_MessageLite + 4) =
             *(undefined4 *)((long)&from_msg[0x2e]._vptr_MessageLite + 4);
      }
      if ((unaff_EBP >> 0x19 & 1) != 0) {
        *(int *)&to_msg[0x2e]._internal_metadata_.ptr_ =
             (int)from_msg[0x2e]._internal_metadata_.ptr_;
      }
      if ((unaff_EBP >> 0x1a & 1) != 0) {
        *(undefined4 *)((long)&to_msg[0x2e]._internal_metadata_.ptr_ + 4) =
             *(undefined4 *)((long)&from_msg[0x2e]._internal_metadata_.ptr_ + 4);
      }
      if ((unaff_EBP >> 0x1b & 1) != 0) {
        puVar9 = (undefined8 *)((ulong)from_msg[0x2f]._vptr_MessageLite & 0xfffffffffffffffc);
        pcVar15 = (char *)*puVar9;
        pMVar17 = (MessageLite *)puVar9[1];
        *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x8000000;
        pMVar18 = to_msg + 0x2f;
        in_RCX = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)in_RCX & 1) != 0) goto LAB_00c1e414;
        goto LAB_00c1df8b;
      }
      goto LAB_00c1df90;
    }
  }
  else {
    pMVar17 = (MessageLite *)from_msg[0x26]._vptr_MessageLite;
    if (pMVar17 != (MessageLite *)0x0) {
      if ((MessageLite *)to_msg[0x26]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var11 = (_func_int **)
                   google::protobuf::Arena::
                   CopyConstruct<edition_unittest::TestAllTypes_OptionalGroup>(arena,pMVar17);
        to_msg[0x26]._vptr_MessageLite = pp_Var11;
      }
      else {
        TestAllTypes_OptionalGroup::MergeImpl((MessageLite *)to_msg[0x26]._vptr_MessageLite,pMVar17)
        ;
      }
      goto LAB_00c1dca9;
    }
    MergeImpl((TestAllTypes *)&stack0xffffffffffffffc8);
LAB_00c1e3e4:
    MergeImpl((TestAllTypes *)&stack0xffffffffffffffc8);
LAB_00c1e3ec:
    MergeImpl((TestAllTypes *)&stack0xffffffffffffffc8);
LAB_00c1e3f4:
    MergeImpl((TestAllTypes *)&stack0xffffffffffffffc8);
LAB_00c1e3fc:
    MergeImpl((TestAllTypes *)&stack0xffffffffffffffc8);
LAB_00c1e404:
    MergeImpl((TestAllTypes *)&stack0xffffffffffffffc8);
LAB_00c1e40c:
    MergeImpl((TestAllTypes *)&stack0xffffffffffffffc8);
    pcVar15 = extraout_RDX_00;
LAB_00c1e414:
    in_RCX = *(Arena **)((ulong)in_RCX & 0xfffffffffffffffe);
LAB_00c1df8b:
    value_03._M_str = pcVar15;
    value_03._M_len = (size_t)pMVar17;
    google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)pMVar18,value_03,in_RCX);
LAB_00c1df90:
    if ((unaff_EBP >> 0x1c & 1) != 0) {
      puVar9 = (undefined8 *)(from_msg[0x2f]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
      pcVar15 = (char *)*puVar9;
      sVar5 = puVar9[1];
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x10000000;
      pAVar12 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar12 & 1) != 0) {
        pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
      }
      value_04._M_str = pcVar15;
      value_04._M_len = sVar5;
      google::protobuf::internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)&to_msg[0x2f]._internal_metadata_,value_04,pAVar12);
    }
    if ((unaff_EBP >> 0x1d & 1) != 0) {
      puVar9 = (undefined8 *)((ulong)from_msg[0x30]._vptr_MessageLite & 0xfffffffffffffffc);
      pcVar15 = (char *)*puVar9;
      sVar5 = puVar9[1];
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x20000000;
      pAVar12 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar12 & 1) != 0) {
        pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
      }
      value_05._M_str = pcVar15;
      value_05._M_len = sVar5;
      google::protobuf::internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)(to_msg + 0x30),value_05,pAVar12);
    }
    if ((unaff_EBP >> 0x1e & 1) != 0) {
      uVar6 = from_msg[0x30]._internal_metadata_.ptr_;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x40000000;
      pAVar12 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar12 & 1) != 0) {
        pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)&to_msg[0x30]._internal_metadata_,
                 (string *)(uVar6 & 0xfffffffffffffffc),pAVar12);
    }
    if ((int)unaff_EBP < 0) {
      pbVar1 = (byte *)((long)&to_msg[1]._vptr_MessageLite + 3);
      *pbVar1 = *pbVar1 | 0x80;
      pMVar18 = from_msg + 0x31;
      if ((((ulong)to_msg[0x31]._vptr_MessageLite & 1) == 0) &&
         (((((InlineData *)&pMVar18->_vptr_MessageLite)->rep_).field_0.data[0] & 1U) == 0)) {
        iVar7 = from_msg[0x31]._internal_metadata_.ptr_;
        to_msg[0x31]._vptr_MessageLite =
             (_func_int **)
             (((InlineData *)&pMVar18->_vptr_MessageLite)->rep_).field_0.as_tree.cordz_info;
        to_msg[0x31]._internal_metadata_.ptr_ = iVar7;
      }
      else {
        absl::lts_20250127::Cord::InlineRep::AssignSlow
                  ((InlineRep *)(to_msg + 0x31),(InlineRep *)pMVar18);
      }
    }
  }
  uVar2 = *(uint *)((long)&from_msg[1]._vptr_MessageLite + 4);
  if ((char)uVar2 != '\0') {
    if ((uVar2 & 1) != 0) {
      to_msg[0x32]._vptr_MessageLite = from_msg[0x32]._vptr_MessageLite;
    }
    if ((uVar2 & 2) != 0) {
      *(int *)&to_msg[0x32]._internal_metadata_.ptr_ = (int)from_msg[0x32]._internal_metadata_.ptr_;
    }
    if ((uVar2 & 4) != 0) {
      *(undefined4 *)((long)&to_msg[0x32]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[0x32]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar2 & 8) != 0) {
      to_msg[0x33]._vptr_MessageLite = from_msg[0x33]._vptr_MessageLite;
    }
    if ((uVar2 & 0x10) != 0) {
      to_msg[0x33]._internal_metadata_.ptr_ = from_msg[0x33]._internal_metadata_.ptr_;
    }
    if ((uVar2 & 0x20) != 0) {
      *(undefined4 *)&to_msg[0x34]._vptr_MessageLite =
           *(undefined4 *)&from_msg[0x34]._vptr_MessageLite;
    }
    if ((uVar2 & 0x40) != 0) {
      *(undefined4 *)((long)&to_msg[0x34]._vptr_MessageLite + 4) =
           *(undefined4 *)((long)&from_msg[0x34]._vptr_MessageLite + 4);
    }
    if ((char)uVar2 < '\0') {
      to_msg[0x34]._internal_metadata_.ptr_ = from_msg[0x34]._internal_metadata_.ptr_;
    }
  }
  if ((uVar2 & 0xff00) != 0) {
    if ((uVar2 >> 8 & 1) != 0) {
      to_msg[0x35]._vptr_MessageLite = from_msg[0x35]._vptr_MessageLite;
    }
    if ((uVar2 >> 9 & 1) != 0) {
      *(int *)&to_msg[0x35]._internal_metadata_.ptr_ = (int)from_msg[0x35]._internal_metadata_.ptr_;
    }
    if ((uVar2 >> 10 & 1) != 0) {
      *(undefined4 *)((long)&to_msg[0x35]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[0x35]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar2 >> 0xb & 1) != 0) {
      to_msg[0x36]._vptr_MessageLite = from_msg[0x36]._vptr_MessageLite;
    }
    if ((uVar2 >> 0xc & 1) != 0) {
      *(char *)&to_msg[0x36]._internal_metadata_.ptr_ =
           (char)from_msg[0x36]._internal_metadata_.ptr_;
    }
    if ((uVar2 >> 0xd & 1) != 0) {
      *(undefined4 *)((long)&to_msg[0x36]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[0x36]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar2 >> 0xe & 1) != 0) {
      *(undefined4 *)&to_msg[0x37]._vptr_MessageLite =
           *(undefined4 *)&from_msg[0x37]._vptr_MessageLite;
    }
    if ((short)uVar2 < 0) {
      *(undefined4 *)((long)&to_msg[0x37]._vptr_MessageLite + 4) =
           *(undefined4 *)((long)&from_msg[0x37]._vptr_MessageLite + 4);
    }
  }
  to_msg[1]._vptr_MessageLite =
       (_func_int **)((ulong)to_msg[1]._vptr_MessageLite | (ulong)from_msg[1]._vptr_MessageLite);
  iVar3 = *(int *)&from_msg[0x38]._vptr_MessageLite;
  if (iVar3 == 0) goto switchD_00c1e1f5_default;
  iVar4 = *(int *)&to_msg[0x38]._vptr_MessageLite;
  if (iVar4 != iVar3) {
    if (iVar4 != 0) {
      clear_oneof_field((TestAllTypes *)to_msg);
    }
    *(int *)&to_msg[0x38]._vptr_MessageLite = iVar3;
  }
  switch(iVar3) {
  case 0x6f:
    *(int *)&to_msg[0x37]._internal_metadata_.ptr_ = (int)from_msg[0x37]._internal_metadata_.ptr_;
    break;
  case 0x70:
  case 0x75:
    if (iVar4 == iVar3) {
      TestAllTypes_NestedMessage::MergeImpl
                ((MessageLite *)to_msg[0x37]._internal_metadata_.ptr_,
                 (MessageLite *)from_msg[0x37]._internal_metadata_.ptr_);
    }
    else {
      pvVar10 = google::protobuf::Arena::CopyConstruct<edition_unittest::TestAllTypes_NestedMessage>
                          (arena,(void *)from_msg[0x37]._internal_metadata_.ptr_);
      to_msg[0x37]._internal_metadata_.ptr_ = (intptr_t)pvVar10;
    }
    break;
  case 0x71:
    if (iVar4 != iVar3) {
      to_msg[0x37]._internal_metadata_.ptr_ =
           (intptr_t)&google::protobuf::internal::fixed_address_empty_string;
    }
    puVar9 = (undefined8 *)(from_msg[0x37]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    psVar13 = puVar9 + 1;
    bVar19 = *(int *)&from_msg[0x38]._vptr_MessageLite == 0x71;
    goto LAB_00c1e330;
  case 0x72:
    if (iVar4 != iVar3) {
      to_msg[0x37]._internal_metadata_.ptr_ =
           (intptr_t)&google::protobuf::internal::fixed_address_empty_string;
    }
    puVar9 = (undefined8 *)(from_msg[0x37]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    psVar13 = puVar9 + 1;
    bVar19 = *(int *)&from_msg[0x38]._vptr_MessageLite == 0x72;
    goto LAB_00c1e330;
  case 0x73:
    if (iVar4 != iVar3) {
      to_msg[0x37]._internal_metadata_.ptr_ =
           (intptr_t)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)&from_msg[0x38]._vptr_MessageLite == 0x73) {
      value = (string *)(from_msg[0x37]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    }
    else {
      value = (string *)&google::protobuf::internal::fixed_address_empty_string;
    }
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[0x37]._internal_metadata_,value,arena);
    break;
  case 0x74:
    if (iVar4 != iVar3) {
      to_msg[0x37]._internal_metadata_.ptr_ =
           (intptr_t)&google::protobuf::internal::fixed_address_empty_string;
    }
    puVar9 = (undefined8 *)(from_msg[0x37]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    psVar13 = puVar9 + 1;
    bVar19 = *(int *)&from_msg[0x38]._vptr_MessageLite == 0x74;
LAB_00c1e330:
    puVar14 = &google::protobuf::internal::fixed_address_empty_string;
    psVar8 = (size_t *)&DAT_019a8320;
    if (bVar19) {
      puVar14 = puVar9;
      psVar8 = psVar13;
    }
    value_06._M_str = (char *)*puVar14;
    value_06._M_len = *psVar8;
    google::protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)&to_msg[0x37]._internal_metadata_,value_06,arena);
  }
switchD_00c1e1f5_default:
  uVar6 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar6 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar6 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TestAllTypes::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestAllTypes*>(&to_msg);
  auto& from = static_cast<const TestAllTypes&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestAllTypes)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_int32()->MergeFrom(from._internal_repeated_int32());
  _this->_internal_mutable_repeated_int64()->MergeFrom(from._internal_repeated_int64());
  _this->_internal_mutable_repeated_uint32()->MergeFrom(from._internal_repeated_uint32());
  _this->_internal_mutable_repeated_uint64()->MergeFrom(from._internal_repeated_uint64());
  _this->_internal_mutable_repeated_sint32()->MergeFrom(from._internal_repeated_sint32());
  _this->_internal_mutable_repeated_sint64()->MergeFrom(from._internal_repeated_sint64());
  _this->_internal_mutable_repeated_fixed32()->MergeFrom(from._internal_repeated_fixed32());
  _this->_internal_mutable_repeated_fixed64()->MergeFrom(from._internal_repeated_fixed64());
  _this->_internal_mutable_repeated_sfixed32()->MergeFrom(from._internal_repeated_sfixed32());
  _this->_internal_mutable_repeated_sfixed64()->MergeFrom(from._internal_repeated_sfixed64());
  _this->_internal_mutable_repeated_float()->MergeFrom(from._internal_repeated_float());
  _this->_internal_mutable_repeated_double()->MergeFrom(from._internal_repeated_double());
  _this->_internal_mutable_repeated_bool()->MergeFrom(from._internal_repeated_bool());
  _this->_internal_mutable_repeated_string()->MergeFrom(from._internal_repeated_string());
  _this->_internal_mutable_repeated_bytes()->MergeFrom(from._internal_repeated_bytes());
  _this->_internal_mutable_repeatedgroup()->MergeFrom(
      from._internal_repeatedgroup());
  _this->_internal_mutable_repeated_nested_message()->MergeFrom(
      from._internal_repeated_nested_message());
  _this->_internal_mutable_repeated_foreign_message()->MergeFrom(
      from._internal_repeated_foreign_message());
  _this->_internal_mutable_repeated_import_message()->MergeFrom(
      from._internal_repeated_import_message());
  _this->_internal_mutable_repeated_nested_enum()->MergeFrom(from._internal_repeated_nested_enum());
  _this->_internal_mutable_repeated_foreign_enum()->MergeFrom(from._internal_repeated_foreign_enum());
  _this->_internal_mutable_repeated_import_enum()->MergeFrom(from._internal_repeated_import_enum());
  _this->_internal_mutable_repeated_string_piece()->MergeFrom(from._internal_repeated_string_piece());
  _this->_internal_mutable_repeated_cord()->MergeFrom(from._internal_repeated_cord());
  _this->_internal_mutable_repeated_lazy_message()->MergeFrom(
      from._internal_repeated_lazy_message());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_optional_string(from._internal_optional_string());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_optional_bytes(from._internal_optional_bytes());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_optional_string_piece(from._internal_optional_string_piece());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_internal_set_optional_cord(from._internal_optional_cord());
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.optionalgroup_ != nullptr);
      if (_this->_impl_.optionalgroup_ == nullptr) {
        _this->_impl_.optionalgroup_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optionalgroup_);
      } else {
        _this->_impl_.optionalgroup_->MergeFrom(*from._impl_.optionalgroup_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(from._impl_.optional_nested_message_ != nullptr);
      if (_this->_impl_.optional_nested_message_ == nullptr) {
        _this->_impl_.optional_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_nested_message_);
      } else {
        _this->_impl_.optional_nested_message_->MergeFrom(*from._impl_.optional_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      ABSL_DCHECK(from._impl_.optional_foreign_message_ != nullptr);
      if (_this->_impl_.optional_foreign_message_ == nullptr) {
        _this->_impl_.optional_foreign_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_foreign_message_);
      } else {
        _this->_impl_.optional_foreign_message_->MergeFrom(*from._impl_.optional_foreign_message_);
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      ABSL_DCHECK(from._impl_.optional_import_message_ != nullptr);
      if (_this->_impl_.optional_import_message_ == nullptr) {
        _this->_impl_.optional_import_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_import_message_);
      } else {
        _this->_impl_.optional_import_message_->MergeFrom(*from._impl_.optional_import_message_);
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      ABSL_DCHECK(from._impl_.optional_public_import_message_ != nullptr);
      if (_this->_impl_.optional_public_import_message_ == nullptr) {
        _this->_impl_.optional_public_import_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_public_import_message_);
      } else {
        _this->_impl_.optional_public_import_message_->MergeFrom(*from._impl_.optional_public_import_message_);
      }
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      ABSL_DCHECK(from._impl_.optional_lazy_message_ != nullptr);
      if (_this->_impl_.optional_lazy_message_ == nullptr) {
        _this->_impl_.optional_lazy_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_lazy_message_);
      } else {
        _this->_impl_.optional_lazy_message_->MergeFrom(*from._impl_.optional_lazy_message_);
      }
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      ABSL_DCHECK(from._impl_.optional_unverified_lazy_message_ != nullptr);
      if (_this->_impl_.optional_unverified_lazy_message_ == nullptr) {
        _this->_impl_.optional_unverified_lazy_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_unverified_lazy_message_);
      } else {
        _this->_impl_.optional_unverified_lazy_message_->MergeFrom(*from._impl_.optional_unverified_lazy_message_);
      }
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      _this->_impl_.optional_int64_ = from._impl_.optional_int64_;
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      _this->_impl_.optional_int32_ = from._impl_.optional_int32_;
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      _this->_impl_.optional_uint32_ = from._impl_.optional_uint32_;
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      _this->_impl_.optional_uint64_ = from._impl_.optional_uint64_;
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      _this->_impl_.optional_sint64_ = from._impl_.optional_sint64_;
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      _this->_impl_.optional_sint32_ = from._impl_.optional_sint32_;
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      _this->_impl_.optional_fixed32_ = from._impl_.optional_fixed32_;
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      _this->_impl_.optional_fixed64_ = from._impl_.optional_fixed64_;
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      _this->_impl_.optional_sfixed64_ = from._impl_.optional_sfixed64_;
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      _this->_impl_.optional_sfixed32_ = from._impl_.optional_sfixed32_;
    }
    if ((cached_has_bits & 0x00200000u) != 0) {
      _this->_impl_.optional_float_ = from._impl_.optional_float_;
    }
    if ((cached_has_bits & 0x00400000u) != 0) {
      _this->_impl_.optional_double_ = from._impl_.optional_double_;
    }
    if ((cached_has_bits & 0x00800000u) != 0) {
      _this->_impl_.optional_bool_ = from._impl_.optional_bool_;
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    if ((cached_has_bits & 0x01000000u) != 0) {
      _this->_impl_.optional_import_enum_ = from._impl_.optional_import_enum_;
    }
    if ((cached_has_bits & 0x02000000u) != 0) {
      _this->_impl_.optional_nested_enum_ = from._impl_.optional_nested_enum_;
    }
    if ((cached_has_bits & 0x04000000u) != 0) {
      _this->_impl_.optional_foreign_enum_ = from._impl_.optional_foreign_enum_;
    }
    if ((cached_has_bits & 0x08000000u) != 0) {
      _this->_internal_set_default_string(from._internal_default_string());
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      _this->_internal_set_default_bytes(from._internal_default_bytes());
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      _this->_internal_set_default_string_piece(from._internal_default_string_piece());
    }
    if ((cached_has_bits & 0x40000000u) != 0) {
      _this->_internal_set_default_cord(from._internal_default_cord());
    }
    if ((cached_has_bits & 0x80000000u) != 0) {
      _this->_internal_set_optional_bytes_cord(from._internal_optional_bytes_cord());
    }
  }
  cached_has_bits = from._impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.default_int64_ = from._impl_.default_int64_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.default_int32_ = from._impl_.default_int32_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.default_uint32_ = from._impl_.default_uint32_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.default_uint64_ = from._impl_.default_uint64_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.default_sint64_ = from._impl_.default_sint64_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.default_sint32_ = from._impl_.default_sint32_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.default_fixed32_ = from._impl_.default_fixed32_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.default_fixed64_ = from._impl_.default_fixed64_;
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.default_sfixed64_ = from._impl_.default_sfixed64_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.default_sfixed32_ = from._impl_.default_sfixed32_;
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      _this->_impl_.default_float_ = from._impl_.default_float_;
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      _this->_impl_.default_double_ = from._impl_.default_double_;
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      _this->_impl_.default_bool_ = from._impl_.default_bool_;
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      _this->_impl_.default_nested_enum_ = from._impl_.default_nested_enum_;
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      _this->_impl_.default_foreign_enum_ = from._impl_.default_foreign_enum_;
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      _this->_impl_.default_import_enum_ = from._impl_.default_import_enum_;
    }
  }
  _this->_impl_._has_bits_.Or(from._impl_._has_bits_);
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_field();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofUint32: {
        _this->_impl_.oneof_field_.oneof_uint32_ = from._impl_.oneof_field_.oneof_uint32_;
        break;
      }
      case kOneofNestedMessage: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_nested_message_);
        } else {
          _this->_impl_.oneof_field_.oneof_nested_message_->MergeFrom(*from._impl_.oneof_field_.oneof_nested_message_);
        }
        break;
      }
      case kOneofString: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_.Set(from._internal_oneof_string(), arena);
        break;
      }
      case kOneofBytes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_.Set(from._internal_oneof_bytes(), arena);
        break;
      }
      case kOneofCord: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_cord_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_cord_.Set(from._internal_oneof_cord(), arena);
        break;
      }
      case kOneofStringPiece: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_piece_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_piece_.Set(from._internal_oneof_string_piece(), arena);
        break;
      }
      case kOneofLazyNestedMessage: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_lazy_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_lazy_nested_message_);
        } else {
          _this->_impl_.oneof_field_.oneof_lazy_nested_message_->MergeFrom(*from._impl_.oneof_field_.oneof_lazy_nested_message_);
        }
        break;
      }
      case ONEOF_FIELD_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}